

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O1

void __thiscall
phyr::ParallelForLoop::ParallelForLoop
          (ParallelForLoop *this,function<void_(phyr::Point2<int>)> *f,Point2i *count)

{
  int iVar1;
  
  (this->func1D).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func1D)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->func1D).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func1D).super__Function_base._M_functor + 8) = 0;
  std::function<void_(phyr::Point2<int>)>::function(&this->func2D,f);
  iVar1 = count->x;
  this->maxIndex = (long)count->y * (long)iVar1;
  this->chunkSize = 1;
  this->nextIndex = 0;
  this->activeWorkers = 0;
  this->next = (ParallelForLoop *)0x0;
  this->nX = iVar1;
  return;
}

Assistant:

ParallelForLoop(const std::function<void(Point2i)>& f, const Point2i& count)
        : func2D(f), maxIndex(count.x * count.y), chunkSize(1) {
        nX = count.x;
    }